

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

void __thiscall
miniscript::Node<XOnlyPubKey>::Node
          (void *param_1,undefined4 param_2,undefined4 param_3,undefined4 param_4)

{
  long lVar1;
  Type TVar2;
  size_t sVar3;
  Node<XOnlyPubKey> *this;
  long in_FS_OFFSET;
  WitnessSize WVar4;
  Node<XOnlyPubKey> *in_stack_00000108;
  Node<XOnlyPubKey> *in_stack_00000130;
  vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)param_1 = param_3;
  *(undefined4 *)((long)param_1 + 4) = param_4;
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::vector(in_stack_ffffffffffffff68);
  this = (Node<XOnlyPubKey> *)((long)param_1 + 0x20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff68);
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::vector((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
            *)in_stack_ffffffffffffff68);
  *(undefined4 *)((long)param_1 + 0x50) = param_2;
  CalcOps(in_stack_00000130);
  CalcStackSize((StackSize *)((long)param_1 + 0x68),(Node<XOnlyPubKey> *)param_1);
  WVar4 = CalcWitnessSize(in_stack_00000108);
  *(WitnessSize *)((long)param_1 + 0x80) = WVar4;
  TVar2 = CalcType((Node<XOnlyPubKey> *)CONCAT44(param_4,in_stack_ffffffffffffffd8));
  *(uint32_t *)((long)param_1 + 0x90) = TVar2.m_flags;
  sVar3 = CalcScriptLen(this);
  *(size_t *)((long)param_1 + 0x98) = sVar3;
  std::optional<bool>::optional((optional<bool> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Node(internal::NoDupCheck, MiniscriptContext script_ctx, Fragment nt, uint32_t val = 0)
        : fragment(nt), k(val), m_script_ctx{script_ctx}, ops(CalcOps()), ss(CalcStackSize()), ws(CalcWitnessSize()), typ(CalcType()), scriptlen(CalcScriptLen()) {}